

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

char * kj::_::fill<kj::ArrayPtr<unsigned_char_const>,kj::StringPtr&,kj::StringPtr>
                 (char *target,Delimited<kj::ArrayPtr<const_unsigned_char>_> *first,StringPtr *rest,
                 StringPtr *rest_1)

{
  char *pcVar1;
  size_t sVar2;
  char *__dest;
  
  __dest = Delimited<kj::ArrayPtr<const_unsigned_char>_>::flattenTo(first,target);
  pcVar1 = (rest->content).ptr;
  sVar2 = (rest->content).size_;
  if (pcVar1 != pcVar1 + (sVar2 - 1)) {
    memcpy(__dest,pcVar1,sVar2 - 1);
    __dest = __dest + (sVar2 - 1);
  }
  pcVar1 = (rest_1->content).ptr;
  sVar2 = (rest_1->content).size_;
  if (pcVar1 != pcVar1 + (sVar2 - 1)) {
    memcpy(__dest,pcVar1,sVar2 - 1);
    __dest = __dest + (sVar2 - 1);
  }
  return __dest;
}

Assistant:

char* fill(char* __restrict__ target, Delimited<T>&& first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}